

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

uint32_t sub_word(uint32_t w,uint8_t *sbox)

{
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  uint8_t d;
  uint8_t c;
  uint8_t b;
  uint8_t *puStack_18;
  uint8_t a;
  uint8_t *sbox_local;
  uint32_t w_local;
  
  local_19 = (byte)(w >> 0x18);
  local_1a = (byte)(w >> 0x10);
  local_1b = (byte)(w >> 8);
  local_1c = (byte)w;
  puStack_18 = sbox;
  sbox_local._4_4_ = w;
  select_u8x4(&local_19,&local_1a,&local_1b,&local_1c,sbox,0x100);
  return (uint)local_19 << 0x18 | (uint)local_1a << 0x10 | (uint)local_1b << 8 | (uint)local_1c;
}

Assistant:

static uint32_t sub_word(uint32_t w, const uint8_t *sbox)
{
  uint8_t a = byte(w, 0),
          b = byte(w, 1),
          c = byte(w, 2),
          d = byte(w, 3);
#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  select_u8x4(&a, &b, &c, &d, sbox, 256);
#else
  a = sbox[a];
  b = sbox[b];
  c = sbox[c];
  d = sbox[d];
#endif
  return word4(a, b, c, d);
}